

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
ref_validator(ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *schema,
             uri *schema_location,string *custom_message)

{
  allocator<char> local_49;
  string local_48;
  
  *(undefined ***)&this->field_0xe8 = &PTR__validator_base_009a9c58;
  *(undefined ***)&this->field_0xf0 = &PTR__ref_009acc40;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"$ref",&local_49);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  keyword_validator(&this->
                     super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ,&PTR_construction_vtable_24__009acb00,&local_48,schema,schema_location,
                    custom_message);
  std::__cxx11::string::~string((string *)&local_48);
  (this->
  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ).super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>.
  super_validation_message_factory._vptr_validation_message_factory = (_func_int **)0x9ac9f8;
  *(undefined8 *)&this->field_0xe8 = 0x9aca88;
  *(undefined8 *)&this->field_0xf0 = 0x9acae0;
  *(undefined8 *)
   &(this->
    super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ).field_0xe0 = 0;
  return;
}

Assistant:

ref_validator(const Json& schema, const uri& schema_location, const std::string& custom_message = std::string{}) 
            : keyword_validator<Json>("$ref", schema, schema_location, custom_message), referred_schema_{nullptr}
        {
            //std::cout << "ref_validator: " << this->schema_location().string() << "\n";
        }